

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::InstantiationStmt::process_port
          (InstantiationStmt *this,Port *port,Generator *parent,string *target_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  int iVar2;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *pvVar3;
  undefined4 extraout_var;
  size_type sVar4;
  VarException *pVVar5;
  element_type *peVar6;
  Var **ppVVar7;
  InternalException *pIVar8;
  undefined4 extraout_var_00;
  reference pvVar9;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Port_*const,_kratos::Var_*>_>,_bool> pVar10;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_bool> pVar11;
  pair<std::__detail::_Node_iterator<kratos::AssignStmt_*,_true,_false>,_bool> pVar12;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c2;
  allocator<char> local_3c1;
  string local_3c0;
  _Base_ptr local_3a0;
  undefined1 local_398;
  element_type *local_390;
  _Base_ptr local_388;
  undefined1 local_380;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_378;
  undefined1 local_370 [8];
  value_type stmt_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sinks;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *local_308;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *slices_1;
  string local_2f8;
  _Node_iterator_base<kratos::AssignStmt_*,_false> local_2d8;
  undefined1 local_2d0;
  element_type *local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  element_type *local_2b0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_298;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_290;
  value_type *stmt;
  Generator *local_280;
  Generator **local_278;
  size_type local_270;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_268;
  string local_250;
  undefined1 local_22a;
  allocator<const_kratos::IRNode_*> local_229;
  Generator *local_228;
  Generator **local_220;
  size_type local_218;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_210;
  string local_1f8;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  local_1c8;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *local_190;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *local_170;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *slices;
  string *port_name;
  string *psStack_158;
  PortDirection port_direction;
  string *target_name_local;
  Generator *parent_local;
  Port *port_local;
  InstantiationStmt *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_e0;
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  string *local_70;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  psStack_158 = target_name;
  target_name_local = (string *)parent;
  parent_local = (Generator *)port;
  port_local = (Port *)this;
  port_name._4_4_ = Port::port_direction(port);
  slices = (vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            *)&parent_local->name;
  if (port_name._4_4_ == In) {
    pvVar3 = Var::get_slices((Var *)parent_local);
    filter_slice_pairs_with_target
              ((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                *)&sources,pvVar3,(Generator *)target_name_local,false);
    local_170 = (vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                 *)&sources;
    iVar2 = (*(parent_local->super_IRNode)._vptr_IRNode[0x10])();
    filter_assignments_with_target
              (&local_1c8,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar2),(Generator *)target_name_local,false);
    local_190 = &local_1c8;
    bVar1 = std::
            vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ::empty(local_170);
    if (!bVar1) {
      slices_1._6_1_ = 1;
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,
                 "Input slices not supported in the statement. Please run a de-couple pass first",
                 (allocator<char> *)((long)&slices_1 + 7));
      InternalException::InternalException(pIVar8,&local_2f8);
      slices_1._6_1_ = 0;
      __cxa_throw(pIVar8,&InternalException::typeinfo,InternalException::~InternalException);
    }
    bVar1 = std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::empty(local_190);
    if (bVar1) {
      local_22a = 1;
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      local_d0 = &local_1f8;
      local_d8 = "{0}.{1} is not connected";
      local_e0 = psStack_158;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)slices;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[25],char>
                (&local_118,(v7 *)"{0}.{1} is not connected",(char (*) [25])psStack_158,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)slices,in_R8);
      local_f0 = &local_118;
      local_128 = fmt::v7::to_string_view<char,_0>(local_d8);
      local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_48 = local_f0;
      local_38 = local_f0;
      local_28 = local_f0;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_f0);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_130.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_128.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_1f8,(detail *)local_128.data_,format_str,args);
      local_228 = parent_local;
      local_220 = &local_228;
      local_218 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_229);
      __l_00._M_len = local_218;
      __l_00._M_array = (iterator)local_220;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_210,__l_00,&local_229);
      VarException::VarException(pVVar5,&local_1f8,&local_210);
      local_22a = 0;
      __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
    }
    sVar4 = std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::size(local_190);
    if (1 < sVar4) {
      stmt._6_1_ = 1;
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      local_60 = &local_250;
      local_68 = "{0}.{1} is driven by multiple nets";
      local_70 = psStack_158;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)slices;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[35],char>
                (&local_a8,(v7 *)"{0}.{1} is driven by multiple nets",(char (*) [35])psStack_158,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)slices,in_R8);
      local_80 = &local_a8;
      local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_50 = &local_c8;
      local_58 = local_80;
      local_20 = local_80;
      local_10 = local_80;
      local_18 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_80);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8.field_1.values_;
      format_str_00.size_ = local_c8.desc_;
      format_str_00.data_ = (char *)local_b8.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_250,(detail *)local_b8.data_,format_str_00,args_00)
      ;
      local_280 = parent_local;
      local_278 = &local_280;
      local_270 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&stmt + 7));
      __l._M_len = local_270;
      __l._M_array = (iterator)local_278;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_268,__l,(allocator<const_kratos::IRNode_*> *)((long)&stmt + 7));
      VarException::VarException(pVVar5,&local_250,&local_268);
      stmt._6_1_ = 0;
      __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
    }
    local_298._M_cur =
         (__node_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::begin(local_190);
    local_290 = &std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           ((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                             *)&local_298)->
                 super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
    peVar6 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_290);
    ppVVar7 = AssignStmt::right(peVar6);
    pVar10 = std::
             map<kratos::Port*,kratos::Var*,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
             ::emplace<kratos::Port*&,kratos::Var*&>
                       ((map<kratos::Port*,kratos::Var*,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                         *)&this->port_mapping_,(Port **)&parent_local,ppVVar7);
    local_2a8 = (_Base_ptr)pVar10.first._M_node;
    local_2a0 = pVar10.second;
    if ((target_name_local[5].field_2._M_local_buf[0xc] & 1U) != 0) {
      local_2b0 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(local_290);
      pVar11 = std::
               map<kratos::Var*,kratos::Stmt*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
               ::emplace<kratos::Port*&,kratos::AssignStmt*>
                         ((map<kratos::Var*,kratos::Stmt*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                           *)&this->port_debug_,(Port **)&parent_local,&local_2b0);
      local_2c0 = (_Base_ptr)pVar11.first._M_node;
      local_2b8 = pVar11.second;
    }
    local_2c8 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(local_290);
    pVar12 = std::
             unordered_set<kratos::AssignStmt*,std::hash<kratos::AssignStmt*>,std::equal_to<kratos::AssignStmt*>,std::allocator<kratos::AssignStmt*>>
             ::emplace<kratos::AssignStmt*>
                       ((unordered_set<kratos::AssignStmt*,std::hash<kratos::AssignStmt*>,std::equal_to<kratos::AssignStmt*>,std::allocator<kratos::AssignStmt*>>
                         *)&this->connection_stmt_,&local_2c8);
    local_2d8._M_cur =
         (__node_type *)pVar12.first.super__Node_iterator_base<kratos::AssignStmt_*,_false>._M_cur;
    local_2d0 = pVar12.second;
    peVar6 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_290);
    (*(peVar6->super_Stmt).super_IRNode._vptr_IRNode[9])();
    std::
    unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
    ::~unordered_set(&local_1c8);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             *)&sources);
  }
  else {
    if (port_name._4_4_ != Out) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Inout port type not implemented",&local_411);
      InternalException::InternalException(pIVar8,&local_410);
      __cxa_throw(pIVar8,&InternalException::typeinfo,InternalException::~InternalException);
    }
    pvVar3 = Var::get_slices((Var *)parent_local);
    filter_slice_pairs_with_target
              ((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                *)&sinks,pvVar3,(Generator *)target_name_local,true);
    local_308 = (vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                 *)&sinks;
    iVar2 = (*(parent_local->super_IRNode)._vptr_IRNode[0xe])();
    filter_assignments_with_target
              ((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)&stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var_00,iVar2),(Generator *)target_name_local,true);
    this_00 = &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    bVar1 = std::
            vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ::empty(local_308);
    if (!bVar1) {
      local_3ea = 1;
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,
                 "Output slices not supported in the statement. Please run a de-couple pass first",
                 &local_3e9);
      InternalException::InternalException(pIVar8,&local_3e8);
      local_3ea = 0;
      __cxa_throw(pIVar8,&InternalException::typeinfo,InternalException::~InternalException);
    }
    bVar1 = std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                     *)this_00);
    if ((bVar1) ||
       (sVar4 = std::
                unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)this_00), sVar4 != 1)) {
      bVar1 = std::
              unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
              ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                       *)this_00);
      if ((!bVar1) &&
         (sVar4 = std::
                  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)this_00), 1 < sVar4)) {
        local_3c2 = 1;
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c0,
                   "Multiple outputs not supported in the statement. Please run a de-couple pass first"
                   ,&local_3c1);
        InternalException::InternalException(pIVar8,&local_3c0);
        local_3c2 = 0;
        __cxa_throw(pIVar8,&InternalException::typeinfo,InternalException::~InternalException);
      }
    }
    else {
      local_378._M_cur =
           (__node_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)this_00);
      pvVar9 = std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
               ::operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *
                           )&local_378);
      std::shared_ptr<kratos::AssignStmt>::shared_ptr
                ((shared_ptr<kratos::AssignStmt> *)local_370,pvVar9);
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_370);
      ppVVar7 = AssignStmt::left(peVar6);
      pVar10 = std::
               map<kratos::Port*,kratos::Var*,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
               ::emplace<kratos::Port*&,kratos::Var*&>
                         ((map<kratos::Port*,kratos::Var*,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                           *)&this->port_mapping_,(Port **)&parent_local,ppVVar7);
      local_388 = (_Base_ptr)pVar10.first._M_node;
      local_380 = pVar10.second;
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_370);
      (*(peVar6->super_Stmt).super_IRNode._vptr_IRNode[9])();
      if ((target_name_local[5].field_2._M_local_buf[0xc] & 1U) != 0) {
        local_390 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                               local_370);
        pVar11 = std::
                 map<kratos::Var*,kratos::Stmt*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                 ::emplace<kratos::Port*&,kratos::AssignStmt*>
                           ((map<kratos::Var*,kratos::Stmt*,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                             *)&this->port_debug_,(Port **)&parent_local,&local_390);
        local_3a0 = (_Base_ptr)pVar11.first._M_node;
        local_398 = pVar11.second;
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_370);
    }
    std::
    unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
    ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)&stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             *)&sinks);
  }
  return;
}

Assistant:

void InstantiationStmt::process_port(kratos::Port *port, Generator *parent,
                                     const std::string &target_name) {
    auto const port_direction = port->port_direction();
    auto const &port_name = port->name;
    if (port_direction == PortDirection::In) {
        // if we're connected to a base variable and no slice, we are good
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, false);
        const auto &sources = filter_assignments_with_target(port->sources(), parent, false);
        // because an input cannot be an register, it can only has one
        // source (all bits combined)
        if (slices.empty()) {
            if (sources.empty())
                throw VarException(::format("{0}.{1} is not connected", target_name, port_name),
                                   {port});
            if (sources.size() > 1)
                throw VarException(
                    ::format("{0}.{1} is driven by multiple nets", target_name, port_name), {port});
            // add it to the port mapping and we are good to go
            auto const &stmt = *sources.begin();
            port_mapping_.emplace(port, stmt->right());
            if (parent->debug) {
                port_debug_.emplace(port, stmt.get());
            }
            // add it to the mapping list
            connection_stmt_.emplace(stmt.get());
            // remove it from the parent
            stmt->remove_from_parent();
        } else {
            // you need to run a de-slice pass on the module references first
            throw InternalException(
                "Input slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else if (port_direction == PortDirection::Out) {
        // need to find out if there is any sources connected to the slices
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, true);
        const auto &sinks = filter_assignments_with_target(port->sinks(), parent, true);
        if (slices.empty()) {
            if (!sinks.empty() && sinks.size() == 1) {
                auto stmt = *sinks.begin();
                port_mapping_.emplace(port, stmt->left());
                stmt->remove_from_parent();
                if (parent->debug) {
                    port_debug_.emplace(port, stmt.get());
                }
            } else if (!sinks.empty() && sinks.size() > 1) {
                throw InternalException(
                    "Multiple outputs not supported in the statement. "
                    "Please run a de-couple pass first");
            }
        } else {
            throw InternalException(
                "Output slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else {
        throw InternalException("Inout port type not implemented");
    }
}